

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_> __thiscall
punky::par::Parser::parse_block_statement(Parser *this)

{
  bool bVar1;
  TokenType TVar2;
  _Alloc_hider _Var3;
  _Head_base<0UL,_punky::ast::StmtNode_*,_false> _Var4;
  BlockStmt *this_00;
  pointer *__ptr;
  Parser *in_RSI;
  Token blk_tok;
  __uniq_ptr_impl<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_> local_98;
  TokenType local_90;
  long *local_88;
  long local_80;
  long local_78 [2];
  char local_68;
  undefined1 local_60 [8];
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_58;
  bool local_38;
  
  local_90 = (in_RSI->m_curr_tok).m_type;
  local_68 = 0;
  bVar1 = (in_RSI->m_curr_tok).m_literal.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged;
  if (bVar1 == true) {
    local_88 = local_78;
    _Var3._M_p = (in_RSI->m_curr_tok).m_literal.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,_Var3._M_p,
               _Var3._M_p +
               (in_RSI->m_curr_tok).m_literal.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._M_value._M_string_length);
  }
  local_68 = bVar1 == true;
  this_00 = (BlockStmt *)operator_new(0x50);
  local_60._0_4_ = local_90;
  local_38 = false;
  if (bVar1 != false) {
    local_58._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_58 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,local_88,local_80 + (long)local_88);
  }
  local_38 = bVar1 != false;
  ast::BlockStmt::BlockStmt(this_00,(Token *)local_60);
  if (local_38 == true) {
    local_38 = false;
    if (local_58._M_value._M_dataplus._M_p != (pointer)((long)&local_58 + 0x10U)) {
      operator_delete((void *)local_58._M_value._M_dataplus._M_p,local_58._16_8_ + 1);
    }
  }
  consume(in_RSI);
  do {
    TVar2 = (in_RSI->m_curr_tok).m_type;
    if (TVar2 == RightBrace) {
      (this->m_lex).m_line._M_dataplus._M_p = (pointer)this_00;
LAB_0010db12:
      if (local_68 == '\x01') {
        local_68 = 0;
        if (local_88 != local_78) {
          operator_delete(local_88,local_78[0] + 1);
        }
      }
      return (__uniq_ptr_data<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>,_true,_true>
              )(__uniq_ptr_data<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>,_true,_true>
                )this;
    }
    if (TVar2 == EOS) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[36]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &in_RSI->m_errors,(char (*) [36])"Block statement missing closing \'}\'");
      (this->m_lex).m_line._M_dataplus._M_p = (pointer)0x0;
      (*(this_00->super_StmtNode).super_AstNode._vptr_AstNode[1])(this_00);
      goto LAB_0010db12;
    }
    parse_statement((Parser *)local_60);
    _Var4._M_head_impl._4_4_ = local_60._4_4_;
    _Var4._M_head_impl._0_4_ = local_60._0_4_;
    if ((_Head_base<0UL,_punky::ast::StmtNode_*,_false>)_Var4._M_head_impl !=
        (_Head_base<0UL,_punky::ast::StmtNode_*,_false>)0x0) {
      local_98._M_t.
      super__Tuple_impl<0UL,_punky::ast::StmtNode_*,_std::default_delete<punky::ast::StmtNode>_>.
      super__Head_base<0UL,_punky::ast::StmtNode_*,_false>._M_head_impl =
           (tuple<punky::ast::StmtNode_*,_std::default_delete<punky::ast::StmtNode>_>)
           (tuple<punky::ast::StmtNode_*,_std::default_delete<punky::ast::StmtNode>_>)
           _Var4._M_head_impl;
      ast::BlockStmt::push_stmt
                (this_00,(unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>
                          *)&local_98);
      if ((_Tuple_impl<0UL,_punky::ast::StmtNode_*,_std::default_delete<punky::ast::StmtNode>_>)
          local_98._M_t.
          super__Tuple_impl<0UL,_punky::ast::StmtNode_*,_std::default_delete<punky::ast::StmtNode>_>
          .super__Head_base<0UL,_punky::ast::StmtNode_*,_false>._M_head_impl != (StmtNode *)0x0) {
        (**(code **)(*(long *)local_98._M_t.
                              super__Tuple_impl<0UL,_punky::ast::StmtNode_*,_std::default_delete<punky::ast::StmtNode>_>
                              .super__Head_base<0UL,_punky::ast::StmtNode_*,_false>._M_head_impl + 8
                    ))();
      }
      local_98._M_t.
      super__Tuple_impl<0UL,_punky::ast::StmtNode_*,_std::default_delete<punky::ast::StmtNode>_>.
      super__Head_base<0UL,_punky::ast::StmtNode_*,_false>._M_head_impl =
           (tuple<punky::ast::StmtNode_*,_std::default_delete<punky::ast::StmtNode>_>)
           (_Tuple_impl<0UL,_punky::ast::StmtNode_*,_std::default_delete<punky::ast::StmtNode>_>)0x0
      ;
    }
    consume(in_RSI);
  } while( true );
}

Assistant:

auto Parser::parse_block_statement() -> std::unique_ptr<ast::BlockStmt>
{
    auto blk_tok = m_curr_tok;
    auto blk     = std::make_unique<ast::BlockStmt>(blk_tok);
    consume();
    while (!curr_type_is(TokenType::RightBrace))
    {
        if (curr_type_is(TokenType::EOS))
        {
            m_errors.emplace_back("Block statement missing closing '}'");
            return nullptr;
        }
        auto stmt = parse_statement();
        if (stmt)
            blk->push_stmt(std::move(stmt));
        consume();
    }
    return blk;
}